

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

MatchInfoCollection * __thiscall
icu_63::TZDBNameSearchHandler::getMatches(TZDBNameSearchHandler *this,int32_t *maxMatchLen)

{
  MatchInfoCollection *pMVar1;
  MatchInfoCollection *results;
  int32_t *maxMatchLen_local;
  TZDBNameSearchHandler *this_local;
  
  pMVar1 = this->fResults;
  *maxMatchLen = this->fMaxMatchLen;
  this->fResults = (MatchInfoCollection *)0x0;
  this->fMaxMatchLen = 0;
  return pMVar1;
}

Assistant:

TimeZoneNames::MatchInfoCollection*
TZDBNameSearchHandler::getMatches(int32_t& maxMatchLen) {
    // give the ownership to the caller
    TimeZoneNames::MatchInfoCollection* results = fResults;
    maxMatchLen = fMaxMatchLen;

    // reset
    fResults = NULL;
    fMaxMatchLen = 0;
    return results;
}